

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

ObjectSlotAttributes * __thiscall
Js::PathTypeHandlerBase::UpdateAttributes
          (PathTypeHandlerBase *this,Recycler *recycler,ObjectSlotAttributes *oldAttributes,
          uint8 oldPathSize,uint8 newTypePathSize)

{
  Recycler *this_00;
  byte *pbVar1;
  byte local_6a;
  byte local_69;
  uint8 i;
  uint8 initStart;
  TrackAllocData local_58;
  ObjectSlotAttributes *local_30;
  ObjectSlotAttributes *newAttributes;
  uint8 newTypePathSize_local;
  ObjectSlotAttributes *pOStack_20;
  uint8 oldPathSize_local;
  ObjectSlotAttributes *oldAttributes_local;
  Recycler *recycler_local;
  PathTypeHandlerBase *this_local;
  
  newAttributes._6_1_ = newTypePathSize;
  newAttributes._7_1_ = oldPathSize;
  pOStack_20 = oldAttributes;
  oldAttributes_local = (ObjectSlotAttributes *)recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&ObjectSlotAttributes::typeinfo,0,(ulong)newTypePathSize,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0x8ea);
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,&local_58);
  local_30 = Memory::AllocateArray<Memory::Recycler,Js::ObjectSlotAttributes,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)newAttributes._6_1_);
  if (pOStack_20 == (ObjectSlotAttributes *)0x0) {
    local_69 = 0;
  }
  else {
    pbVar1 = min<unsigned_char>((uchar *)((long)&newAttributes + 6),
                                (uchar *)((long)&newAttributes + 7));
    local_69 = *pbVar1;
    memcpy(local_30,pOStack_20,(ulong)local_69);
  }
  for (local_6a = local_69; local_6a < newAttributes._6_1_; local_6a = local_6a + 1) {
    local_30[local_6a] = ObjectSlotAttr_Default;
  }
  return local_30;
}

Assistant:

ObjectSlotAttributes * PathTypeHandlerBase::UpdateAttributes(Recycler * recycler, ObjectSlotAttributes * oldAttributes, uint8 oldPathSize, uint8 newTypePathSize)
    {
        ObjectSlotAttributes * newAttributes = RecyclerNewArrayLeaf(recycler, ObjectSlotAttributes, newTypePathSize);
        uint8 initStart;
        if (oldAttributes == nullptr)
        {
            initStart = 0;
        }
        else
        {
            // In branching cases, the new type path may be shorter than the old.
            initStart = min(newTypePathSize, oldPathSize);
            memcpy(newAttributes, oldAttributes, sizeof(ObjectSlotAttributes) * initStart);
        }
        for (uint8 i = initStart; i < newTypePathSize; i++)
        {
            newAttributes[i] = ObjectSlotAttr_Default;
        }

        return newAttributes;
    }